

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetDirectoryPropertiesCommand.h
# Opt level: O2

void __thiscall
cmSetDirectoryPropertiesCommand::~cmSetDirectoryPropertiesCommand
          (cmSetDirectoryPropertiesCommand *this)

{
  cmCommand::~cmCommand(&this->super_cmCommand);
  operator_delete(this,0x30);
  return;
}

Assistant:

cmCommand* Clone() override { return new cmSetDirectoryPropertiesCommand; }